

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O3

int SetFrame(int frame_num,WebPIterator *iter)

{
  int iVar1;
  undefined8 *puVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  undefined8 *puVar9;
  size_t sVar10;
  long lVar11;
  long lVar12;
  
  puVar2 = (undefined8 *)iter->private_;
  iVar8 = 0;
  if ((-1 < frame_num && puVar2 != (undefined8 *)0x0) &&
     (iVar1 = *(int *)((long)puVar2 + 0x44), iVar8 = 0, frame_num <= iVar1)) {
    puVar9 = puVar2;
    if (frame_num == 0) {
      frame_num = iVar1;
    }
    do {
      puVar9 = (undefined8 *)puVar9[9];
      if (puVar9 == (undefined8 *)0x0) {
        return 0;
      }
    } while (*(int *)(puVar9 + 4) != frame_num);
    lVar3 = puVar2[4];
    lVar4 = puVar9[5];
    sVar10 = puVar9[6];
    lVar5 = puVar9[8];
    lVar11 = lVar4;
    if (lVar5 != 0) {
      lVar11 = puVar9[7];
      lVar12 = (lVar4 - lVar5) - lVar11;
      if (lVar4 == 0) {
        lVar12 = 0;
      }
      sVar10 = sVar10 + lVar5 + lVar12;
    }
    iVar8 = 0;
    if (lVar3 != 0) {
      iter->frame_num = frame_num;
      iter->num_frames = iVar1;
      uVar6 = *puVar9;
      uVar7 = puVar9[1];
      iter->x_offset = (int)uVar6;
      iter->y_offset = (int)((ulong)uVar6 >> 0x20);
      iter->width = (int)uVar7;
      iter->height = (int)((ulong)uVar7 >> 0x20);
      iter->has_alpha = *(int *)(puVar9 + 2);
      uVar6 = *(undefined8 *)((long)puVar9 + 0x14);
      iter->duration = (int)uVar6;
      iter->dispose_method = (int)((ulong)uVar6 >> 0x20);
      iter->blend_method = *(WebPMuxAnimBlend *)((long)puVar9 + 0x1c);
      iter->complete = *(int *)((long)puVar9 + 0x24);
      (iter->fragment).bytes = (uint8_t *)(lVar3 + lVar11);
      (iter->fragment).size = sVar10;
      iVar8 = 1;
    }
  }
  return iVar8;
}

Assistant:

static int SetFrame(int frame_num, WebPIterator* const iter) {
  const Frame* frame;
  const WebPDemuxer* const dmux = (WebPDemuxer*)iter->private_;
  if (dmux == NULL || frame_num < 0) return 0;
  if (frame_num > dmux->num_frames_) return 0;
  if (frame_num == 0) frame_num = dmux->num_frames_;

  frame = GetFrame(dmux, frame_num);
  if (frame == NULL) return 0;

  return SynthesizeFrame(dmux, frame, iter);
}